

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

double bfrac(double *a,double *b,double *x,double *y,double *lambda,double *eps)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  
  dVar3 = brcomp(a,b,x,y);
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    dVar7 = *lambda + 1.0;
    dVar1 = *a;
    dVar11 = 1.0 / dVar1 + 1.0;
    dVar12 = dVar1 + 1.0;
    auVar13._0_8_ = dVar7 / dVar11;
    auVar13._8_8_ = 0x3ff0000000000000;
    dVar15 = 0.0;
    dVar4 = 1.0;
    dVar5 = 0.0;
    dVar14 = dVar11 / dVar7;
    dVar9 = 1.0;
    while( true ) {
      dVar15 = dVar15 + 1.0;
      dVar6 = dVar15 / dVar1;
      dVar8 = (*b - dVar15) * dVar15 * *x;
      dVar10 = (dVar15 * (*y + 1.0) + dVar7) * ((dVar6 + 1.0) / (dVar11 + dVar6 + dVar6)) +
               dVar8 / dVar12 + dVar15;
      dVar9 = (dVar1 / dVar12) * dVar9 * (*b / dVar1 + dVar9) * (dVar1 / dVar12) * *x * dVar8;
      dVar4 = dVar9 * dVar4 + dVar10 * auVar13._0_8_;
      dVar9 = (dVar9 * dVar5 + dVar10 * auVar13._8_8_) / dVar4;
      if (ABS(dVar9 - dVar14) <= dVar9 * *eps) break;
      dVar12 = dVar12 + 2.0;
      auVar2._8_8_ = dVar4;
      auVar2._0_8_ = dVar4;
      auVar13 = divpd(auVar13,auVar2);
      dVar4 = auVar13._0_8_;
      dVar5 = auVar13._8_8_;
      auVar13._8_8_ = dVar9;
      auVar13._0_8_ = 1.0;
      dVar14 = dVar9;
      dVar9 = dVar6 + 1.0;
    }
    dVar3 = dVar3 * dVar9;
  }
  return dVar3;
}

Assistant:

double bfrac(double *a,double *b,double *x,double *y,double *lambda,
             double *eps)
/*
-----------------------------------------------------------------------
     CONTINUED FRACTION EXPANSION FOR IX(A,B) WHEN A,B .GT. 1.
     IT IS ASSUMED THAT  LAMBDA = (A + B)*Y - B.
-----------------------------------------------------------------------
*/
{
static double bfrac,alpha,an,anp1,beta,bn,bnp1,c,c0,c1,e,n,p,r,r0,s,t,w,yp1;
/*
     ..
     .. Executable Statements ..
*/
    bfrac = brcomp(a,b,x,y);
    if(bfrac == 0.0e0) return bfrac;
    c = 1.0e0+*lambda;
    c0 = *b/ *a;
    c1 = 1.0e0+1.0e0/ *a;
    yp1 = *y+1.0e0;
    n = 0.0e0;
    p = 1.0e0;
    s = *a+1.0e0;
    an = 0.0e0;
    bn = anp1 = 1.0e0;
    bnp1 = c/c1;
    r = c1/c;
S10:
/*
        CONTINUED FRACTION CALCULATION
*/
    n += 1.0e0;
    t = n/ *a;
    w = n*(*b-n)**x;
    e = *a/s;
    alpha = p*(p+c0)*e*e*(w**x);
    e = (1.0e0+t)/(c1+t+t);
    beta = n+w/s+e*(c+n*yp1);
    p = 1.0e0+t;
    s += 2.0e0;
/*
        UPDATE AN, BN, ANP1, AND BNP1
*/
    t = alpha*an+beta*anp1;
    an = anp1;
    anp1 = t;
    t = alpha*bn+beta*bnp1;
    bn = bnp1;
    bnp1 = t;
    r0 = r;
    r = anp1/bnp1;
    if(fabs(r-r0) <= *eps*r) goto S20;
/*
        RESCALE AN, BN, ANP1, AND BNP1
*/
    an /= bnp1;
    bn /= bnp1;
    anp1 = r;
    bnp1 = 1.0e0;
    goto S10;
S20:
/*
                 TERMINATION
*/
    bfrac *= r;
    return bfrac;
}